

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> *
OpenMD::operator-(DynamicVector<double,_std::allocator<double>_> *v1,
                 DynamicVector<double,_std::allocator<double>_> *v2)

{
  DynamicVector<double,_std::allocator<double>_> *in_RDX;
  DynamicVector<double,_std::allocator<double>_> *in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  DynamicVector<double,_std::allocator<double>_> *result;
  size_type in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  DynamicVector<double,_std::allocator<double>_>::size
            ((DynamicVector<double,_std::allocator<double>_> *)0x260c3f);
  std::allocator<double>::allocator((allocator<double> *)0x260c53);
  DynamicVector<double,_std::allocator<double>_>::DynamicVector
            (in_RDI,in_stack_ffffffffffffffa8,(allocator_type *)0x260c67);
  std::allocator<double>::~allocator((allocator<double> *)0x260c73);
  DynamicVector<double,_std::allocator<double>_>::sub
            (in_RSI,in_RDX,
             (DynamicVector<double,_std::allocator<double>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  return in_RDI;
}

Assistant:

DynamicVector<Real> operator-(const DynamicVector<Real>& v1,
                                const DynamicVector<Real>& v2) {
    assert(v1.size() == v2.size());
    DynamicVector<Real> result(v1.size());
    result.sub(v1, v2);
    return result;
  }